

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O0

int __thiscall CDemoPlayer::SetPos(CDemoPlayer *this,int WantedTick)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  CDemoPlayer *in_RDI;
  float fVar4;
  int Keyframe;
  float Percent;
  int KeyframeWantedTick;
  int in_stack_ffffffffffffffd0;
  uint3 uVar5;
  uint in_stack_ffffffffffffffd4;
  int local_4;
  uint offset;
  
  if (in_RDI->m_File == (IOHANDLE)0x0) {
    local_4 = -1;
  }
  else {
    iVar1 = clamp<int>(in_ESI,(in_RDI->m_Info).m_Info.m_FirstTick,(in_RDI->m_Info).m_Info.m_LastTick
                      );
    iVar3 = iVar1 + -5;
    fVar4 = (float)(iVar3 - (in_RDI->m_Info).m_Info.m_FirstTick) /
            (float)((in_RDI->m_Info).m_Info.m_LastTick - (in_RDI->m_Info).m_Info.m_FirstTick);
    iVar2 = clamp<int>((int)((float)(in_RDI->m_Info).m_SeekablePoints * fVar4),0,
                       (in_RDI->m_Info).m_SeekablePoints + -1);
    while( true ) {
      offset = in_stack_ffffffffffffffd4 & 0xffffff;
      if (iVar2 < (in_RDI->m_Info).m_SeekablePoints + -1) {
        offset = CONCAT13(in_RDI->m_pKeyFrames[iVar2].m_Tick < iVar3,(int3)in_stack_ffffffffffffffd4
                         );
      }
      if ((char)(offset >> 0x18) == '\0') break;
      iVar2 = iVar2 + 1;
      in_stack_ffffffffffffffd4 = offset;
    }
    while( true ) {
      uVar5 = (uint3)(ushort)offset;
      if (0 < iVar2) {
        uVar5 = CONCAT12(iVar3 < in_RDI->m_pKeyFrames[iVar2].m_Tick,(ushort)offset);
      }
      offset = CONCAT13((char)(offset >> 0x18),uVar5);
      if ((char)(uVar5 >> 0x10) == '\0') break;
      iVar2 = iVar2 + -1;
    }
    io_seek((IOHANDLE)in_RDI,offset,in_stack_ffffffffffffffd0);
    (in_RDI->m_Info).m_NextTick = -1;
    (in_RDI->m_Info).m_Info.m_CurrentTick = -1;
    (in_RDI->m_Info).m_PreviousTick = -1;
    while ((in_RDI->m_Info).m_NextTick < iVar1) {
      DoTick(in_RDI);
    }
    Play((CDemoPlayer *)CONCAT44(fVar4,iVar2));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CDemoPlayer::SetPos(int WantedTick)
{
	if(!m_File)
		return -1;

	WantedTick = clamp(WantedTick, m_Info.m_Info.m_FirstTick, m_Info.m_Info.m_LastTick);
	int KeyframeWantedTick = WantedTick - 5; // -5 because we have to have a current tick and previous tick when we do the playback
	const float Percent = (KeyframeWantedTick - m_Info.m_Info.m_FirstTick) / float(m_Info.m_Info.m_LastTick - m_Info.m_Info.m_FirstTick);

	// get correct key frame
	int Keyframe = clamp((int)(m_Info.m_SeekablePoints*Percent), 0, m_Info.m_SeekablePoints-1);
	while(Keyframe < m_Info.m_SeekablePoints-1 && m_pKeyFrames[Keyframe].m_Tick < KeyframeWantedTick)
		Keyframe++;
	while(Keyframe > 0 && m_pKeyFrames[Keyframe].m_Tick > KeyframeWantedTick)
		Keyframe--;

	// seek to the correct keyframe
	io_seek(m_File, m_pKeyFrames[Keyframe].m_Filepos, IOSEEK_START);

	m_Info.m_NextTick = -1;
	m_Info.m_Info.m_CurrentTick = -1;
	m_Info.m_PreviousTick = -1;

	// playback everything until we hit our tick
	while(m_Info.m_NextTick < WantedTick)
		DoTick();

	Play();

	return 0;
}